

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base>::
do_deliver_message(local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this
                  ,type_index *msg_type,message_ref_t *message,uint overlimit_reaction_deep)

{
  deliver_op_tracer local_25;
  uint local_24;
  deliver_op_tracer tracer;
  message_ref_t *pmStack_20;
  uint overlimit_reaction_deep_local;
  message_ref_t *message_local;
  type_index *msg_type_local;
  local_mbox_template<so_5::impl::msg_tracing_helpers::tracing_disabled_base> *this_local;
  
  local_24 = overlimit_reaction_deep;
  pmStack_20 = message;
  msg_tracing_helpers::tracing_disabled_base::deliver_op_tracer::deliver_op_tracer
            (&local_25,(tracing_disabled_base *)this,&this->super_abstract_message_box_t,
             "deliver_message",msg_type,message,overlimit_reaction_deep);
  ensure_immutable_message(this,msg_type,pmStack_20);
  do_deliver_message_impl(this,&local_25,msg_type,pmStack_20,local_24);
  return;
}

Assistant:

virtual void
		do_deliver_message(
			const std::type_index & msg_type,
			const message_ref_t & message,
			unsigned int overlimit_reaction_deep ) const override
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as TRACING_BASE
						*this, // as abstract_message_box_t
						"deliver_message",
						msg_type, message, overlimit_reaction_deep };

				ensure_immutable_message( msg_type, message );

				do_deliver_message_impl(
						tracer,
						msg_type,
						message,
						overlimit_reaction_deep );
			}